

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

void __thiscall
TempTrackerBase::OrHashTableOfBitVector
          (TempTrackerBase *this,
          HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *toData,
          HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> **fromData,
          bool deleteData)

{
  int iVar1;
  SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
  *pSVar2;
  code *pcVar3;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> **ppHVar4;
  bool bVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  Type *pTVar8;
  Type *pTVar9;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  EditingIterator local_90;
  anon_class_16_2_64671122 local_78;
  ulong local_68;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *local_60;
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> **local_58;
  undefined4 *local_50;
  undefined4 local_44;
  undefined1 local_40 [8];
  Iterator iter2;
  
  local_44 = (undefined4)CONCAT71(in_register_00000009,deleteData);
  if (toData == (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x91,"(toData != nullptr)","toData != nullptr");
    if (!bVar5) goto LAB_005bd0ad;
    *puVar6 = 0;
  }
  local_60 = *fromData;
  local_58 = fromData;
  if (local_60 == (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x92,"(fromData != nullptr)","fromData != nullptr");
    if (!bVar5) {
LAB_005bd0ad:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    local_60 = *local_58;
  }
  else {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  local_78.deleteData = SUB41(local_44,0);
  uVar11 = 0;
  local_78.this = this;
  local_50 = puVar6;
LAB_005bcd81:
  ppHVar4 = local_58;
  if (toData->tableSize <= uVar11) {
    if ((char)local_44 != '\0') {
      HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::Delete(*local_58);
      *ppHVar4 = (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
    }
    return;
  }
  iter2.list = local_60->table + uVar11;
  local_68 = uVar11;
  local_40 = (undefined1  [8])iter2.list;
  if (iter2.list ==
      (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount> *
      )0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar5) goto LAB_005bd0ad;
    *puVar6 = 0;
  }
  pSVar2 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
            *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
  iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                *)0x0;
  if ((undefined1  [8])pSVar2 != local_40) {
    iter2.list = pSVar2;
  }
  local_90.super_Iterator.list = toData->table + uVar11;
  local_90.last = (NodeBase *)0x0;
  local_90.super_Iterator.current =
       &(local_90.super_Iterator.list)->super_SListNodeBase<Memory::ArenaAllocator>;
  while (bVar5 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                 ::EditingIterator::Next(&local_90), puVar6 = local_50, bVar5) {
    pTVar7 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data(&local_90.super_Iterator);
    while (((iter2.list !=
             (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
              *)0x0 && ((undefined1  [8])iter2.list != local_40)) &&
           (iVar1 = pTVar7->value,
           pTVar8 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                    ::Iterator::Data((Iterator *)local_40), iVar1 < pTVar8->value))) {
      pTVar8 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
               ::EditingIterator::InsertNodeBefore(&local_90,toData->alloc);
      pTVar9 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)local_40);
      pTVar8->value = pTVar9->value;
      pTVar9 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)local_40);
      pBVar10 = OrHashTableOfBitVector::anon_class_16_2_64671122::operator()
                          (&local_78,(BVSparse<Memory::JitArenaAllocator> *)0x0,pTVar9->element);
      pTVar8->element = pBVar10;
      if (iter2.list ==
          (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = local_50;
        *local_50 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_005bd0ad;
        *puVar6 = 0;
      }
      pSVar2 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
    }
    puVar6 = local_50;
    if ((iter2.list ==
         (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0) || ((undefined1  [8])iter2.list == local_40)) break;
    iVar1 = pTVar7->value;
    pTVar8 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_40);
    if (iVar1 == pTVar8->value) {
      pBVar10 = pTVar7->element;
      pTVar8 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
               ::Iterator::Data((Iterator *)local_40);
      pBVar10 = OrHashTableOfBitVector::anon_class_16_2_64671122::operator()
                          (&local_78,pBVar10,pTVar8->element);
      pTVar7->element = pBVar10;
      if (iter2.list ==
          (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
           *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = local_50;
        *local_50 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) goto LAB_005bd0ad;
        *puVar6 = 0;
      }
      pSVar2 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                    *)0x0;
      if ((undefined1  [8])pSVar2 != local_40) {
        iter2.list = pSVar2;
      }
    }
  }
  do {
    if ((iter2.list ==
         (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
          *)0x0) || ((undefined1  [8])iter2.list == local_40)) break;
    pTVar7 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::EditingIterator::InsertNodeBefore(&local_90,toData->alloc);
    pTVar8 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_40);
    pTVar7->value = pTVar8->value;
    pTVar8 = SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
             ::Iterator::Data((Iterator *)local_40);
    pBVar10 = OrHashTableOfBitVector::anon_class_16_2_64671122::operator()
                        (&local_78,(BVSparse<Memory::JitArenaAllocator> *)0x0,pTVar8->element);
    pTVar7->element = pBVar10;
    if (iter2.list ==
        (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
         *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar5) goto LAB_005bd0ad;
      *puVar6 = 0;
    }
    pSVar2 = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
              *)((iter2.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    iter2.list = (SListBase<Bucket<BVSparse<Memory::JitArenaAllocator>_*>,_Memory::ArenaAllocator,_RealCount>
                  *)0x0;
    if ((undefined1  [8])pSVar2 != local_40) {
      iter2.list = pSVar2;
    }
  } while( true );
  uVar11 = local_68 + 1;
  goto LAB_005bcd81;
}

Assistant:

void
TempTrackerBase::OrHashTableOfBitVector(HashTable<BVSparse<JitArenaAllocator> *> * toData, HashTable<BVSparse<JitArenaAllocator> *> *& fromData, bool deleteData)
{
    Assert(toData != nullptr);
    Assert(fromData != nullptr);
    toData->Or(fromData,
        [=](BVSparse<JitArenaAllocator> * bv1, BVSparse<JitArenaAllocator> * bv2) -> BVSparse<JitArenaAllocator> *
    {
        if (bv1 == nullptr)
        {
            if (deleteData)
            {
                return bv2;
            }
            return bv2->CopyNew(this->GetAllocator());
        }
        bv1->Or(bv2);
        if (deleteData)
        {
            JitAdelete(this->GetAllocator(), bv2);
        }
        return bv1;
    });

    if (deleteData)
    {
        fromData->Delete();
        fromData = nullptr;
    }
}